

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Sol * exampleA(Sol *__return_storage_ptr__,vector<ride,_std::allocator<ride>_> *rides,long vehs)

{
  allocator_type local_11;
  
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::vector(__return_storage_ptr__,vehs,&local_11);
  std::vector<ride,_std::allocator<ride>_>::push_back
            ((__return_storage_ptr__->
             super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<ride,_std::allocator<ride>_>::push_back
            ((__return_storage_ptr__->
             super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1,
             (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
             super__Vector_impl_data._M_start + 2);
  std::vector<ride,_std::allocator<ride>_>::push_back
            ((__return_storage_ptr__->
             super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1,
             (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
             super__Vector_impl_data._M_start + 1);
  return __return_storage_ptr__;
}

Assistant:

Sol exampleA(const vector<ride>& rides, const long vehs) {
    Sol sol(vehs);

    // Example A:
    sol[0].push_back(rides[0]);
    sol[1].push_back(rides[2]);
    sol[1].push_back(rides[1]);

    return sol;
}